

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O2

bool google::protobuf::internal::ReflectionOps::IsInitialized
               (Message *message,bool check_fields,bool check_descendants)

{
  bool bVar1;
  int iVar2;
  Descriptor *this;
  Reflection *this_00;
  FieldDescriptor *this_01;
  long lVar3;
  Nullable<const_char_*> failure_msg;
  Descriptor *this_02;
  MessageLite *pMVar4;
  FieldDescriptor *pFVar5;
  MapFieldBase *this_03;
  MessageFactory *pMVar6;
  undefined4 extraout_var;
  ExtensionSet *this_04;
  int index;
  FieldDescriptor *field_1;
  FieldDescriptor *field;
  FieldDescriptor *pFVar7;
  long lVar8;
  Metadata MVar9;
  MapIterator end_map;
  MapIterator it;
  
  MVar9 = Message::GetMetadata(message);
  this = MVar9.descriptor;
  this_00 = GetReflectionOrDie(message);
  iVar2 = this->field_count_;
  lVar8 = (long)iVar2;
  if (lVar8 != 0) {
    this_01 = Descriptor::field(this,0);
    lVar3 = lVar8 * 0x58;
    it.iter_.node_ = (NodeBase *)Descriptor::field(this,iVar2 + -1);
    end_map.iter_.node_ = (NodeBase *)(this_01 + lVar8 + -1);
    failure_msg = absl::lts_20250127::log_internal::
                  Check_EQImpl<google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*>
                            ((FieldDescriptor **)&it,(FieldDescriptor **)&end_map,
                             "descriptor->field(field_count - 1) == end - 1");
    if (failure_msg != (Nullable<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&it,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_ops.cc"
                 ,0xb3,failure_msg);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&it);
    }
    pFVar7 = this_01;
    if (check_fields) {
      for (; lVar3 != 0; lVar3 = lVar3 + -0x58) {
        bVar1 = FieldDescriptor::is_required(pFVar7);
        if ((bVar1) && (bVar1 = Reflection::HasField(this_00,message,pFVar7), !bVar1)) {
          return false;
        }
        pFVar7 = pFVar7 + 1;
      }
    }
    if (!check_descendants) {
      return true;
    }
    pFVar7 = this_01 + lVar8;
    for (; this_01 != pFVar7; this_01 = this_01 + 1) {
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)this_01->type_ * 4) == 10) {
        this_02 = FieldDescriptor::message_type(this_01);
        if ((this_02->options_->field_0)._impl_.map_entry_ == true) {
          pFVar5 = Descriptor::field(this_02,1);
          if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar5->type_ * 4) == 10) {
            this_03 = Reflection::GetMapData(this_00,message,this_01);
            bVar1 = MapFieldBase::IsMapValid(this_03);
            if (bVar1) {
              MapIterator::MapIterator(&it,message,this_01);
              MapIterator::MapIterator(&end_map,message,this_01);
              MapFieldBase::MapBegin(this_03,&it);
              MapFieldBase::MapEnd(this_03,&end_map);
              while (bVar1 = protobuf::operator!=(&it,&end_map), bVar1) {
                pMVar4 = &MapValueConstRef::GetMessageValue(&it.value_.super_MapValueConstRef)->
                          super_MessageLite;
                bVar1 = MessageLite::IsInitialized(pMVar4);
                if (!bVar1) {
                  return false;
                }
                MapIterator::operator++(&it);
              }
            }
          }
        }
        else {
          bVar1 = FieldDescriptor::is_repeated(this_01);
          if (bVar1) {
            iVar2 = Reflection::FieldSize(this_00,message,this_01);
            index = 0;
            if (iVar2 < 1) {
              iVar2 = index;
            }
            while (iVar2 != index) {
              pMVar4 = &Reflection::GetRepeatedMessage(this_00,message,this_01,index)->
                        super_MessageLite;
              bVar1 = MessageLite::IsInitialized(pMVar4);
              index = index + 1;
              if (!bVar1) {
                return false;
              }
            }
          }
          else {
            bVar1 = Reflection::HasField(this_00,message,this_01);
            if (bVar1) {
              pMVar4 = &Reflection::GetMessage(this_00,message,this_01,(MessageFactory *)0x0)->
                        super_MessageLite;
              bVar1 = MessageLite::IsInitialized(pMVar4);
              if (!bVar1) {
                return false;
              }
            }
          }
        }
      }
    }
  }
  if ((check_descendants) && ((this_00->schema_).extensions_offset_ != -1)) {
    pMVar6 = MessageFactory::generated_factory();
    iVar2 = (*pMVar6->_vptr_MessageFactory[2])(pMVar6,this);
    this_04 = Reflection::GetExtensionSet(this_00,message);
    bVar1 = ExtensionSet::IsInitialized(this_04,(MessageLite *)CONCAT44(extraout_var,iVar2));
    if (!bVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

bool ReflectionOps::IsInitialized(const Message& message, bool check_fields,
                                  bool check_descendants) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* reflection = GetReflectionOrDie(message);
  if (const int field_count = descriptor->field_count()) {
    const FieldDescriptor* begin = descriptor->field(0);
    const FieldDescriptor* end = begin + field_count;
    ABSL_DCHECK_EQ(descriptor->field(field_count - 1), end - 1);

    if (check_fields) {
      // Check required fields of this message.
      for (const FieldDescriptor* field = begin; field != end; ++field) {
        if (field->is_required() && !reflection->HasField(message, field)) {
          return false;
        }
      }
    }

    if (check_descendants) {
      for (const FieldDescriptor* field = begin; field != end; ++field) {
        if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
          const Descriptor* message_type = field->message_type();
          if (ABSL_PREDICT_FALSE(message_type->options().map_entry())) {
            if (message_type->field(1)->cpp_type() ==
                FieldDescriptor::CPPTYPE_MESSAGE) {
              const MapFieldBase* map_field =
                  reflection->GetMapData(message, field);
              if (map_field->IsMapValid()) {
                MapIterator it(const_cast<Message*>(&message), field);
                MapIterator end_map(const_cast<Message*>(&message), field);
                for (map_field->MapBegin(&it), map_field->MapEnd(&end_map);
                     it != end_map; ++it) {
                  if (!it.GetValueRef().GetMessageValue().IsInitialized()) {
                    return false;
                  }
                }
              }
            }
          } else if (field->is_repeated()) {
            const int size = reflection->FieldSize(message, field);
            for (int j = 0; j < size; j++) {
              if (!reflection->GetRepeatedMessage(message, field, j)
                       .IsInitialized()) {
                return false;
              }
            }
          } else if (reflection->HasField(message, field)) {
            if (!reflection->GetMessage(message, field).IsInitialized()) {
              return false;
            }
          }
        }
      }
    }
  }
  if (check_descendants && reflection->HasExtensionSet(message)) {
    // Note that "extendee" is only referenced if the extension is lazily parsed
    // (e.g. LazyMessageExtensionImpl), which requires a verification function
    // to be generated.
    //
    // Dynamic messages would get null prototype from the generated message
    // factory but their verification functions are not generated. Therefore, it
    // it will always be eagerly parsed and "extendee" here will not be
    // referenced.
    const Message* extendee =
        MessageFactory::generated_factory()->GetPrototype(descriptor);
    if (!reflection->GetExtensionSet(message).IsInitialized(extendee)) {
      return false;
    }
  }
  return true;
}